

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O1

size_t duckdb_zstd::HUF_decompress4X2_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  BYTE *pBVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  BYTE *pBVar10;
  uint uVar11;
  long unaff_RBP;
  size_t sVar12;
  int iVar13;
  HUF_DTable *pHVar14;
  HUF_DTable *in_R10;
  HUF_DTable *pHVar15;
  ulong uVar16;
  uint uVar17;
  ulong unaff_R13;
  ulong uVar18;
  bool bVar19;
  HUF_DecompressFastArgs args;
  HUF_DecompressFastArgs local_c8;
  
  pHVar14 = DTable;
  sVar5 = HUF_DecompressFastArgs_init(&local_c8,dst,dstSize,cSrc,cSrcSize,DTable);
  if (0xffffffffffffff87 < sVar5 - 1) {
    return sVar5;
  }
  pBVar6 = (BYTE *)((~((long)dstSize >> 0x3f) & dstSize) + (long)dst);
  HUF_decompress4X2_usingDTable_internal_fast_c_loop(&local_c8);
  uVar7 = dstSize + 3 >> 2;
  lVar8 = 0;
LAB_01dbee34:
  uVar9 = (long)pBVar6 - (long)dst;
  dst = (BYTE *)((long)dst + uVar7);
  if (uVar9 < uVar7) {
    dst = pBVar6;
  }
  if ((dst < local_c8.op[lVar8]) ||
     (pHVar15 = (HUF_DTable *)local_c8.ip[lVar8], pHVar15 < local_c8.iend[lVar8] + -8)) {
    bVar19 = false;
    sVar12 = 0xffffffffffffffec;
    pHVar15 = in_R10;
  }
  else {
    unaff_RBP = *(long *)pHVar15;
    unaff_R13 = 0;
    for (uVar9 = local_c8.bits[lVar8]; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
      unaff_R13 = unaff_R13 + 1;
    }
    cSrcSize = (long)local_c8.ilowest + 8;
    bVar19 = true;
    sVar12 = 0;
    pHVar14 = (HUF_DTable *)local_c8.ilowest;
  }
  if (bVar19) {
    pBVar1 = local_c8.op[lVar8];
    iVar13 = (int)pHVar14;
    pBVar10 = pBVar1;
    if (7 < (ulong)((long)dst - (long)pBVar1)) {
      do {
        uVar17 = (uint)unaff_R13;
        if (uVar17 < 0x41) {
          if (pHVar15 < cSrcSize) {
            if (pHVar15 == pHVar14) {
              bVar19 = false;
              goto LAB_01dbef18;
            }
            uVar9 = unaff_R13 >> 3 & 0x1fffffff;
            bVar19 = pHVar14 <= (HUF_DTable *)((long)pHVar15 - uVar9);
            uVar11 = (int)pHVar15 - iVar13;
            if (bVar19) {
              uVar11 = (uint)uVar9;
            }
            uVar17 = uVar17 + uVar11 * -8;
          }
          else {
            uVar11 = (uint)(unaff_R13 >> 3) & 0x1fffffff;
            uVar17 = uVar17 & 7;
            bVar19 = true;
          }
          unaff_R13 = (ulong)uVar17;
          pHVar15 = (HUF_DTable *)((long)pHVar15 - (ulong)uVar11);
          unaff_RBP = *(long *)pHVar15;
        }
        else {
          bVar19 = false;
          pHVar15 = (HUF_DTable *)&BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
        }
LAB_01dbef18:
        if (((BYTE *)((long)dst + -9) <= pBVar10) || (!bVar19)) goto LAB_01dbf05c;
        uVar9 = (ulong)(unaff_RBP << (unaff_R13 & 0x3f)) >> 0x35;
        *(short *)pBVar10 = (short)DTable[uVar9 + 1];
        uVar17 = (uint)*(byte *)((long)DTable + uVar9 * 4 + 6) + (int)unaff_R13;
        uVar18 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar9 = (ulong)(unaff_RBP << ((ulong)uVar17 & 0x3f)) >> 0x35;
        *(short *)(pBVar10 + uVar18) = (short)DTable[uVar9 + 1];
        uVar17 = *(byte *)((long)DTable + uVar9 * 4 + 6) + uVar17;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        lVar3 = uVar9 + uVar18;
        uVar16 = (ulong)(unaff_RBP << ((ulong)uVar17 & 0x3f)) >> 0x35;
        *(short *)(pBVar10 + uVar9 + uVar18) = (short)DTable[uVar16 + 1];
        uVar17 = *(byte *)((long)DTable + uVar16 * 4 + 6) + uVar17;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar4 = uVar9 + lVar3;
        uVar18 = (ulong)(unaff_RBP << ((ulong)uVar17 & 0x3f)) >> 0x35;
        *(short *)(pBVar10 + uVar9 + lVar3) = (short)DTable[uVar18 + 1];
        uVar17 = *(byte *)((long)DTable + uVar18 * 4 + 6) + uVar17;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
        uVar18 = (ulong)(unaff_RBP << ((ulong)uVar17 & 0x3f)) >> 0x35;
        *(short *)(pBVar10 + uVar9 + lVar4) = (short)DTable[uVar18 + 1];
        unaff_R13 = (ulong)(*(byte *)((long)DTable + uVar18 * 4 + 6) + uVar17);
        pBVar10 = pBVar10 + (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7) + uVar9 + lVar4;
      } while( true );
    }
    uVar17 = (uint)unaff_R13;
    if (uVar17 < 0x41) {
      if (pHVar15 < cSrcSize) {
        if (pHVar15 == pHVar14) goto LAB_01dbf05c;
        uVar18 = unaff_R13 >> 3 & 0x1fffffff;
        uVar9 = (ulong)(uint)((int)pHVar15 - iVar13);
        if (pHVar14 <= (HUF_DTable *)((long)pHVar15 - uVar18)) {
          uVar9 = uVar18;
        }
        uVar17 = uVar17 + (int)uVar9 * -8;
      }
      else {
        uVar9 = unaff_R13 >> 3 & 0x1fffffff;
        uVar17 = uVar17 & 7;
      }
      unaff_R13 = (ulong)uVar17;
      pHVar15 = (HUF_DTable *)((long)pHVar15 - uVar9);
      unaff_RBP = *(long *)pHVar15;
    }
    else {
      pHVar15 = (HUF_DTable *)&BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    }
LAB_01dbf05c:
    if (1 < (ulong)((long)dst - (long)pBVar10)) {
      do {
        uVar17 = (uint)unaff_R13;
        if (uVar17 < 0x41) {
          if (pHVar15 < cSrcSize) {
            if (pHVar15 == pHVar14) {
              bVar19 = false;
              goto LAB_01dbf0bd;
            }
            uVar18 = unaff_R13 >> 3 & 0x1fffffff;
            bVar19 = pHVar14 <= (HUF_DTable *)((long)pHVar15 - uVar18);
            uVar9 = (ulong)(uint)((int)pHVar15 - iVar13);
            if (bVar19) {
              uVar9 = uVar18;
            }
            uVar17 = uVar17 + (int)uVar9 * -8;
          }
          else {
            uVar9 = unaff_R13 >> 3 & 0x1fffffff;
            uVar17 = uVar17 & 7;
            bVar19 = true;
          }
          unaff_R13 = (ulong)uVar17;
          pHVar15 = (HUF_DTable *)((long)pHVar15 - uVar9);
          unaff_RBP = *(long *)pHVar15;
        }
        else {
          bVar19 = false;
          pHVar15 = (HUF_DTable *)&BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
        }
LAB_01dbf0bd:
        if (((BYTE *)((long)dst + -2) < pBVar10) || (!bVar19)) goto LAB_01dbf128;
        uVar9 = (ulong)(unaff_RBP << (unaff_R13 & 0x3f)) >> 0x35;
        *(short *)pBVar10 = (short)DTable[uVar9 + 1];
        pBVar10 = pBVar10 + *(byte *)((long)DTable + uVar9 * 4 + 7);
        unaff_R13 = (ulong)((uint)*(byte *)((long)DTable + uVar9 * 4 + 6) + (int)unaff_R13);
      } while( true );
    }
    goto LAB_01dbf131;
  }
  bVar19 = false;
  goto LAB_01dbf196;
LAB_01dbf128:
  for (; pBVar10 <= (BYTE *)((long)dst + -2);
      pBVar10 = pBVar10 + *(byte *)((long)DTable + uVar9 * 4 + 7)) {
    uVar9 = (ulong)(unaff_RBP << (unaff_R13 & 0x3f)) >> 0x35;
    *(short *)pBVar10 = (short)DTable[uVar9 + 1];
    unaff_R13 = (ulong)((uint)*(byte *)((long)DTable + uVar9 * 4 + 6) + (int)unaff_R13);
  }
LAB_01dbf131:
  if (pBVar10 < dst) {
    uVar9 = (ulong)(unaff_RBP << (unaff_R13 & 0x3f)) >> 0x35;
    *pBVar10 = (BYTE)DTable[uVar9 + 1];
    uVar17 = (uint)unaff_R13;
    if (*(char *)((long)DTable + uVar9 * 4 + 7) == '\x01') {
      unaff_R13 = (ulong)(uVar17 + *(byte *)((long)DTable + uVar9 * 4 + 6));
    }
    else if ((uVar17 < 0x40) &&
            (uVar17 = uVar17 + *(byte *)((long)DTable + uVar9 * 4 + 6), unaff_R13 = (ulong)uVar17,
            0x3f < uVar17)) {
      unaff_R13 = 0x40;
    }
    pBVar10 = pBVar10 + 1;
  }
  pBVar2 = local_c8.op[lVar8];
  local_c8.op[lVar8] = pBVar10 + ((long)pBVar2 - (long)pBVar1);
  bVar19 = pBVar10 + ((long)pBVar2 - (long)pBVar1) == (BYTE *)dst;
  sVar12 = sVar5;
  if (!bVar19) {
    sVar12 = 0xffffffffffffffec;
  }
LAB_01dbf196:
  if (!bVar19) {
    return sVar12;
  }
  lVar8 = lVar8 + 1;
  in_R10 = pHVar15;
  sVar5 = sVar12;
  if (lVar8 == 4) {
    return dstSize;
  }
  goto LAB_01dbee34;
}

Assistant:

static HUF_FAST_BMI2_ATTRS size_t
HUF_decompress4X2_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn) {
    void const* dt = DTable + 1;
    const BYTE* const ilowest = (const BYTE*)cSrc;
    BYTE* const oend = ZSTD_maybeNullPtrAdd((BYTE*)dst, dstSize);
    HUF_DecompressFastArgs args;
    {
        size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init asm args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilowest);
    loopFn(&args);

    /* note : op4 already verified within main loop */
    assert(args.ip[0] >= ilowest);
    assert(args.ip[1] >= ilowest);
    assert(args.ip[2] >= ilowest);
    assert(args.ip[3] >= ilowest);
    assert(args.op[3] <= oend);

    assert(ilowest == args.ilowest);
    assert(ilowest + 6 == args.iend[0]);
    (void)ilowest;

    /* finish bitStreams one by one */
    {
        size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            args.op[i] += HUF_decodeStreamX2(args.op[i], &bit, segmentEnd, (HUF_DEltX2 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd)
                return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    return dstSize;
}